

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O1

int __thiscall
libcellml::Variable::clone
          (Variable *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  long lVar4;
  Entity *this_00;
  NamedEntity *this_01;
  VariablePtr VVar5;
  string local_40;
  
  VVar5 = create();
  if (*(__fn **)(*(long *)(__fn + 8) + 0x110) != (__fn *)0x0) {
    pp_Var2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
    Units::clone((Units *)&local_40,*(__fn **)(*(long *)(__fn + 8) + 0x110),
                 VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi,__flags,__arg);
    p_Var3 = pp_Var2[1];
    *(pointer *)(p_Var3 + 0x110) = local_40._M_dataplus._M_p;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var3 + 0x118),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_40._M_string_length);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_40._M_string_length);
    }
  }
  pp_Var2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  paVar1 = &local_40.field_2;
  lVar4 = *(long *)(*(long *)(__fn + 8) + 0xd0);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,lVar4,*(long *)(*(long *)(__fn + 8) + 0xd8) + lVar4);
  std::__cxx11::string::_M_assign((string *)(pp_Var2[1] + 0xd0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  pp_Var2 = (this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  lVar4 = *(long *)(*(long *)(__fn + 8) + 0xf0);
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,lVar4,*(long *)(*(long *)(__fn + 8) + 0xf8) + lVar4);
  std::__cxx11::string::_M_assign((string *)(pp_Var2[1] + 0xf0));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this_00 = (Entity *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  Entity::id_abi_cxx11_(&local_40,(Entity *)__fn);
  Entity::setId(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this_01 = (NamedEntity *)(this->super_NamedEntity).super_ParentedEntity.super_Entity._vptr_Entity;
  NamedEntity::name_abi_cxx11_(&local_40,(NamedEntity *)__fn);
  NamedEntity::setName(this_01,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return (int)this;
}

Assistant:

VariablePtr Variable::clone() const
{
    auto v = create();

    if (pFunc()->mUnits != nullptr) {
        v->setUnits(pFunc()->mUnits->clone());
    }
    v->setInitialValue(initialValue());
    v->setInterfaceType(interfaceType());
    v->setId(id());
    v->setName(name());

    return v;
}